

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Check_Browser.cxx
# Opt level: O1

cb_item * __thiscall Fl_Check_Browser::find_item(Fl_Check_Browser *this,int n)

{
  int iVar1;
  cb_item *pcVar2;
  int iVar3;
  
  if ((n < 1) || (pcVar2 = this->first, pcVar2 == (cb_item *)0x0 || this->nitems_ < n)) {
    return (cb_item *)0x0;
  }
  iVar1 = this->cached_item;
  if (iVar1 == n) {
    pcVar2 = (cb_item *)&this->cache;
  }
  else if (iVar1 + 1 == n) {
    pcVar2 = this->cache;
  }
  else {
    iVar3 = n;
    if (iVar1 + -1 != n) goto LAB_001a9a50;
    pcVar2 = (cb_item *)&this->cache->prev;
  }
  pcVar2 = pcVar2->next;
  iVar3 = 1;
LAB_001a9a50:
  while (iVar3 + -1 != 0) {
    pcVar2 = pcVar2->next;
    iVar3 = iVar3 + -1;
  }
  this->cache = pcVar2;
  this->cached_item = n;
  return pcVar2;
}

Assistant:

Fl_Check_Browser::cb_item *Fl_Check_Browser::find_item(int n) const {
	int i = n;
	cb_item *p = first;

	if (n <= 0 || n > nitems_ || p == 0) {
		return 0;
	}

	if (n == cached_item) {
		p = cache;
		n = 1;
	} else if (n == cached_item + 1) {
		p = cache->next;
		n = 1;
	} else if (n == cached_item - 1) {
		p = cache->prev;
		n = 1;
	}

	while (--n) {
		p = p->next;
	}

	/* Cast to not const and cache it. */

	((Fl_Check_Browser *)this)->cache = p;
	((Fl_Check_Browser *)this)->cached_item = i;

	return p;
}